

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O3

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::ClearTest::PrepareFramebuffer
          (ClearTest *this,GLenum buffer,GLenum internalformat)

{
  undefined8 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLuint *pGVar5;
  undefined4 *puVar6;
  ulong uVar7;
  long lVar8;
  GLint max_color_attachments;
  undefined1 local_1b0 [384];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  if ((this->m_fbo == 0) && (this->m_renderbuffers == (GLuint *)0x0)) {
    (**(code **)(lVar4 + 0x6d0))(1,&this->m_fbo);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x9e5);
    (**(code **)(lVar4 + 0x78))(0x8d40,this->m_fbo);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,"glBindFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x9e8);
    if (buffer == 0x84f9) {
      pGVar5 = (GLuint *)operator_new__(4);
      this->m_renderbuffers = pGVar5;
      (**(code **)(lVar4 + 0x6e8))(1,pGVar5);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGenRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0xa15);
      (**(code **)(lVar4 + 0xa0))(0x8d41,*this->m_renderbuffers);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glBindRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0xa18);
      this->m_renderbuffers_count = 1;
      (**(code **)(lVar4 + 0x1238))(0x8d41,internalformat,1,1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glRenderbufferStorage has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0xa1d);
      (**(code **)(lVar4 + 0x688))(0x8d40,0x821a,0x8d41,*this->m_renderbuffers);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glFramebufferRenderbuffer has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0xa21);
    }
    else if (buffer == 0x1800) {
      local_1b0._0_4_ = 8;
      (**(code **)(lVar4 + 0x868))(0x8cdf,local_1b0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGetIntegerv has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x9f0);
      uVar1 = local_1b0._0_8_;
      uVar7 = 0xffffffffffffffff;
      if (-1 < (long)(int)local_1b0._0_4_) {
        uVar7 = (long)(int)local_1b0._0_4_ * 4;
      }
      pGVar5 = (GLuint *)operator_new__(uVar7);
      this->m_renderbuffers = pGVar5;
      (**(code **)(lVar4 + 0x6e8))(uVar1 & 0xffffffff,pGVar5);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glGenRenderbuffers has failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                      ,0x9f9);
      this->m_renderbuffers_count = local_1b0._0_4_;
      if (0 < (int)local_1b0._0_4_) {
        lVar8 = 0;
        do {
          (**(code **)(lVar4 + 0xa0))(0x8d41,this->m_renderbuffers[lVar8]);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glBindRenderbuffer has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0xa00);
          (**(code **)(lVar4 + 0x1238))(0x8d41,internalformat,1,1);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glRenderbufferStorage has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0xa03);
          (**(code **)(lVar4 + 0x688))
                    (0x8d40,(int)lVar8 + 0x8ce0,0x8d41,this->m_renderbuffers[lVar8]);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"glFramebufferRenderbuffer has failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                          ,0xa07);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (int)local_1b0._0_4_);
      }
    }
    iVar2 = (**(code **)(lVar4 + 0x170))(0x8d40);
    if (iVar2 == 0x8cd5) {
      return;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1b0 + 8),"Framebuffer is unexpectedly incomplete.",0x27);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1b0);
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0;
  __cxa_throw(puVar6,&int::typeinfo,0);
}

Assistant:

void ClearTest::PrepareFramebuffer(glw::GLenum buffer, glw::GLenum internalformat)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Check that ther is no other fbo. */
	if ((0 != m_fbo) || (DE_NULL != m_renderbuffers))
	{
		throw 0;
	}

	/* Prepare framebuffer... */
	gl.genFramebuffers(1, &m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffers has failed");

	if (buffer == GL_COLOR)
	{
		glw::GLint max_color_attachments =
			8; /* OpenGL 4.5 specification default (see Implementation Dependent Values tables). */

		gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

		m_renderbuffers = new glw::GLuint[max_color_attachments];

		if (m_renderbuffers)
		{
			/* ... with renderbuffer color attachments. */

			gl.genRenderbuffers(max_color_attachments, m_renderbuffers);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

			m_renderbuffers_count = max_color_attachments;

			for (glw::GLint i = 0; i < max_color_attachments; ++i)
			{
				gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffers[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

				gl.renderbufferStorage(GL_RENDERBUFFER, internalformat, 1, 1);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

				gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + i, GL_RENDERBUFFER,
										   m_renderbuffers[i]);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
			}
		}
	}

	if (buffer == GL_DEPTH_STENCIL)
	{
		/* ... with depth and stencil attachments. */

		m_renderbuffers = new glw::GLuint[1];

		if (m_renderbuffers)
		{
			gl.genRenderbuffers(1, m_renderbuffers);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGenRenderbuffers has failed");

			gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffers[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer has failed");

			m_renderbuffers_count = 1;

			gl.renderbufferStorage(GL_RENDERBUFFER, internalformat, 1, 1);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glRenderbufferStorage has failed");

			gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_STENCIL_ATTACHMENT, GL_RENDERBUFFER,
									   m_renderbuffers[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer has failed");
		}
	}

	/* Check that framebuffer is complete. */
	if (GL_FRAMEBUFFER_COMPLETE != gl.checkFramebufferStatus(GL_FRAMEBUFFER))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Framebuffer is unexpectedly incomplete."
											<< tcu::TestLog::EndMessage;

		throw 0;
	}
}